

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall amrex::StateData::restartDoit(StateData *this,istream *is,string *chkfile)

{
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var1;
  MultiFab *pMVar2;
  StateData *pSVar3;
  int iVar4;
  int ngrow;
  MFInfo *pMVar5;
  MultiFab *pMVar6;
  iterator iVar7;
  char *faHeader;
  FabArray<amrex::FArrayBox> *pFVar8;
  int nsets;
  string mf_name;
  string FullHeaderPathName;
  string FullPathName;
  int local_c4;
  StateData *local_c0;
  MFInfo local_b8;
  key_type local_88;
  string local_68;
  DistributionMapping *local_48;
  BoxArray *local_40;
  istream *local_38;
  
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  local_38 = is;
  std::istream::operator>>((istream *)is,&local_c4);
  iVar4 = StateDescriptor::nComp(this->desc);
  local_c0 = (StateData *)CONCAT44(local_c0._4_4_,iVar4);
  iVar4 = StateDescriptor::nExtra(this->desc);
  local_b8._0_8_ =
       (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x1;
  local_b8.arena = (Arena *)0x0;
  local_b8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar5 = MFInfo::SetTag(&local_b8,"StateData");
  pMVar5->arena = this->arena;
  _Var1._M_head_impl =
       (this->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  pMVar6 = (MultiFab *)operator_new(0x180);
  local_40 = &this->grids;
  local_48 = &this->dmap;
  MultiFab::MultiFab(pMVar6,local_40,local_48,(int)local_c0,iVar4,pMVar5,_Var1._M_head_impl);
  pMVar2 = (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->new_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar6;
  local_c0 = this;
  if (pMVar2 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar2 = (local_c0->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (local_c0->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  if (pMVar2 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  pSVar3 = local_c0;
  if (local_c4 == 2) {
    iVar4 = StateDescriptor::nComp(local_c0->desc);
    ngrow = StateDescriptor::nExtra(pSVar3->desc);
    local_b8._0_8_ =
         (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    local_b8.arena = (Arena *)0x0;
    local_b8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar5 = MFInfo::SetTag(&local_b8,"StateData");
    pMVar5->arena = pSVar3->arena;
    _Var1._M_head_impl =
         (pSVar3->m_factory)._M_t.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    pMVar6 = (MultiFab *)operator_new(0x180);
    MultiFab::MultiFab(pMVar6,local_40,local_48,iVar4,ngrow,pMVar5,_Var1._M_head_impl);
    pMVar2 = (local_c0->old_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    (local_c0->old_data)._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar6;
    if (pMVar2 != (MultiFab *)0x0) {
      (**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  if (local_c4 == 0) {
    pFVar8 = &((local_c0->new_data)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar8,0.0,0,(pFVar8->super_FabArrayBase).n_comp,&(pFVar8->super_FabArrayBase).n_grow
              );
  }
  local_b8._0_8_ = &local_b8.tags;
  iVar4 = 0;
  local_b8.arena = (Arena *)0x0;
  local_b8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_b8.tags.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (0 < local_c4) {
    do {
      iVar4 = iVar4 + 1;
      if (iVar4 == 2) {
        pFVar8 = &((local_c0->old_data)._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                  super_FabArray<amrex::FArrayBox>;
      }
      else if (iVar4 == 1) {
        pFVar8 = &((local_c0->new_data)._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                  super_FabArray<amrex::FArrayBox>;
      }
      else {
        Abort_host("**** Error in StateData::restart:  invalid nsets.");
        pFVar8 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      std::operator>>(local_38,(string *)&local_b8);
      std::__cxx11::string::_M_assign((string *)&local_68);
      if ((chkfile->_M_string_length != 0) &&
         ((chkfile->_M_dataplus)._M_p[chkfile->_M_string_length - 1] != '/')) {
        std::__cxx11::string::push_back((char)&local_68);
      }
      std::__cxx11::string::_M_append((char *)&local_68,local_b8._0_8_);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
      std::__cxx11::string::append((char *)&local_88);
      if (faHeaderMap_abi_cxx11_ ==
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
           *)0x0) {
LAB_005e22d4:
        faHeader = (char *)0x0;
      }
      else {
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
                ::find(faHeaderMap_abi_cxx11_,&local_88);
        if ((_Rb_tree_header *)iVar7._M_node ==
            &(faHeaderMap_abi_cxx11_->_M_impl).super__Rb_tree_header) goto LAB_005e22d4;
        faHeader = *(char **)(iVar7._M_node + 2);
      }
      VisMF::Read(pFVar8,&local_68,faHeader,0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    } while (iVar4 < local_c4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_b8._0_8_ != &local_b8.tags) {
    operator_delete((void *)local_b8._0_8_,
                    (ulong)((long)&((local_b8.tags.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1));
  }
  return;
}

Assistant:

void
StateData::restartDoit (std::istream& is, const std::string& chkfile)
{
    BL_PROFILE("StateData::restartDoit()");

    is >> old_time.start;
    is >> old_time.stop;
    is >> new_time.start;
    is >> new_time.stop;

    int nsets;
    is >> nsets;

    new_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
    if (nsets == 2) {
        old_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                              MFInfo().SetTag("StateData").SetArena(arena),
                                              *m_factory);
    }
    //
    // If no data is written then we just allocate the MF instead of reading it in.
    // This assumes that the application will do something with it.
    // We set it to zero in case a compiler complains about uninitialized data.
    //
    if (nsets == 0) {
       new_data->setVal(0.0_rt);
    }

    std::string mf_name;
    std::string FullPathName;

    for(int ns(1); ns <= nsets; ++ns) {
        MultiFab *whichMF = nullptr;
        if(ns == 1) {
            whichMF = new_data.get();
        } else if(ns == 2) {
            whichMF = old_data.get();
        } else {
            amrex::Abort("**** Error in StateData::restart:  invalid nsets.");
        }

        is >> mf_name;
        //
        // Note that mf_name is relative to the Header file.
        // We need to prepend the name of the chkfile directory.
        //
        FullPathName = chkfile;
        if ( ! chkfile.empty() && chkfile[chkfile.length()-1] != '/') {
            FullPathName += '/';
        }
        FullPathName += mf_name;

        // ---- check for preread header
        std::string FullHeaderPathName(FullPathName + "_H");
        const char *faHeader = 0;
        if(faHeaderMap != 0) {
            std::map<std::string, Vector<char> >::iterator fahmIter;
            fahmIter = faHeaderMap->find(FullHeaderPathName);
            if(fahmIter != faHeaderMap->end()) {
                faHeader = fahmIter->second.dataPtr();
            }
        }

        VisMF::Read(*whichMF, FullPathName, faHeader);
    }
}